

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::piece_picker::shuffle(piece_picker *this,int priority,prio_index_t elem_index)

{
  int iVar1;
  prio_index_t pVar2;
  pointer psVar3;
  pointer ppVar4;
  pointer psVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  psVar3 = (this->m_priority_boundaries).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (priority == 0) {
    lVar7 = 0;
    uVar8 = 0;
  }
  else {
    lVar7 = (long)priority;
    uVar8 = psVar3[lVar7 + -1].m_val;
  }
  lVar7 = random((aux *)(ulong)(~uVar8 + psVar3[lVar7].m_val));
  iVar6 = (int)lVar7 + uVar8;
  if (iVar6 != elem_index.m_val) {
    ppVar4 = (this->m_piece_map).
             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             .
             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (this->m_pieces).
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             .
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = psVar5[elem_index.m_val].m_val;
    pVar2.m_val = ((prio_index_t *)((long)(ppVar4 + psVar5[iVar6].m_val) + 4))->m_val;
    ((prio_index_t *)((long)(ppVar4 + psVar5[iVar6].m_val) + 4))->m_val =
         ((prio_index_t *)((long)(ppVar4 + iVar1) + 4))->m_val;
    ((prio_index_t *)((long)(ppVar4 + iVar1) + 4))->m_val = pVar2.m_val;
    iVar1 = psVar5[iVar6].m_val;
    psVar5[iVar6].m_val = psVar5[elem_index.m_val].m_val;
    psVar5[elem_index.m_val].m_val = iVar1;
  }
  return;
}

Assistant:

void piece_picker::shuffle(int const priority, prio_index_t const elem_index)
	{
#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "shuffle()" << std::endl;
#endif

		TORRENT_ASSERT(!m_dirty);
		TORRENT_ASSERT(priority >= 0);
		TORRENT_ASSERT(elem_index >= prio_index_t(0));
		TORRENT_ASSERT(elem_index < m_pieces.end_index());
		TORRENT_ASSERT(m_piece_map[m_pieces[elem_index]].priority(this) == priority);

		auto const range = priority_range(priority);
		prio_index_t const other_index(
			int(random(aux::numeric_cast<std::uint32_t>(static_cast<int>(range.second - range.first) - 1)))
			+ static_cast<int>(range.first));

		if (other_index == elem_index) return;

		// swap other_index with elem_index
		piece_pos& p1 = m_piece_map[m_pieces[other_index]];
		piece_pos& p2 = m_piece_map[m_pieces[elem_index]];

		std::swap(p1.index, p2.index);
		std::swap(m_pieces[other_index], m_pieces[elem_index]);
	}